

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::DistantLightSource::writeTo(DistantLightSource *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  affine3f *in_RDI;
  
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<pbrt::math::affine3f>(in_RSI,in_RDI);
  return 0x47;
}

Assistant:

int DistantLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(L);
    binary.write(scale);
    binary.write(transform);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }